

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O1

string * duckdb::StringUtil::ToJSONMap
                   (string *__return_storage_ptr__,
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *map)

{
  yyjson_val_pool *pool;
  bool bVar1;
  yyjson_mut_doc *doc;
  yyjson_mut_val *root;
  
  root = (yyjson_mut_val *)0x0;
  doc = duckdb_yyjson::yyjson_mut_doc_new((yyjson_alc *)0x0);
  if (doc == (yyjson_mut_doc *)0x0) goto LAB_001dcb51;
  pool = &doc->val_pool;
  if ((doc->val_pool).end == (doc->val_pool).cur) {
    bVar1 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pool,&doc->alc,1);
    if (bVar1) goto LAB_001dcb37;
    root = (yyjson_mut_val *)0x0;
  }
  else {
LAB_001dcb37:
    root = pool->cur;
    pool->cur = root + 1;
  }
  if (root == (yyjson_mut_val *)0x0) {
    root = (yyjson_mut_val *)0x0;
  }
  else {
    root->tag = 7;
  }
LAB_001dcb51:
  if (doc != (yyjson_mut_doc *)0x0) {
    doc->root = root;
  }
  ToJsonMapInternal(__return_storage_ptr__,map,doc,root);
  return __return_storage_ptr__;
}

Assistant:

string StringUtil::ToJSONMap(const unordered_map<string, string> &map) {
	yyjson_mut_doc *doc = yyjson_mut_doc_new(nullptr);
	yyjson_mut_val *root = yyjson_mut_obj(doc);
	yyjson_mut_doc_set_root(doc, root);

	return ToJsonMapInternal(map, doc, root);
}